

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O1

EStatusCode __thiscall
Type1ToCFFEmbeddedFontWriter::WritePrivateDictionary(Type1ToCFFEmbeddedFontWriter *this)

{
  OutputStringBufferStream *this_00;
  CFFPrimitiveWriter *inWriter;
  double inValue;
  EStatusCode EVar1;
  LongFilePositionType LVar2;
  long lVar3;
  ulong inValue_00;
  Type1ToCFFEmbeddedFontWriter *pTVar4;
  
  this_00 = &this->mFontFileStream;
  pTVar4 = (Type1ToCFFEmbeddedFontWriter *)this_00;
  LVar2 = OutputStringBufferStream::GetCurrentPosition(this_00);
  this->mPrivatePosition = LVar2;
  inWriter = &this->mPrimitivesWriter;
  AddDeltaVectorIfNotEmpty(pTVar4,inWriter,&(this->mType1Input).mPrivateDictionary.BlueValues,6);
  AddDeltaVectorIfNotEmpty(pTVar4,inWriter,&(this->mType1Input).mPrivateDictionary.OtherBlues,7);
  AddDeltaVectorIfNotEmpty(pTVar4,inWriter,&(this->mType1Input).mPrivateDictionary.FamilyBlues,8);
  AddDeltaVectorIfNotEmpty
            (pTVar4,inWriter,&(this->mType1Input).mPrivateDictionary.FamilyOtherBlues,9);
  inValue = (this->mType1Input).mPrivateDictionary.BlueScale;
  if ((inValue != 0.039625) || (NAN(inValue))) {
    CFFPrimitiveWriter::WriteRealOperand(inWriter,inValue,10);
    CFFPrimitiveWriter::WriteDictOperator(inWriter,0xc09);
  }
  lVar3 = (long)(this->mType1Input).mPrivateDictionary.BlueShift;
  if (lVar3 != 7) {
    CFFPrimitiveWriter::WriteIntegerOperand(inWriter,lVar3);
    CFFPrimitiveWriter::WriteDictOperator(inWriter,0xc0a);
  }
  lVar3 = (long)(this->mType1Input).mPrivateDictionary.BlueFuzz;
  if (lVar3 != 1) {
    CFFPrimitiveWriter::WriteIntegerOperand(inWriter,lVar3);
    CFFPrimitiveWriter::WriteDictOperator(inWriter,0xc0b);
  }
  CFFPrimitiveWriter::WriteRealOperand(inWriter,(this->mType1Input).mPrivateDictionary.StdHW,10);
  CFFPrimitiveWriter::WriteDictOperator(inWriter,10);
  CFFPrimitiveWriter::WriteRealOperand(inWriter,(this->mType1Input).mPrivateDictionary.StdVW,10);
  pTVar4 = (Type1ToCFFEmbeddedFontWriter *)inWriter;
  CFFPrimitiveWriter::WriteDictOperator(inWriter,0xb);
  AddDeltaVectorIfNotEmpty(pTVar4,inWriter,&(this->mType1Input).mPrivateDictionary.StemSnapH,0xc0c);
  AddDeltaVectorIfNotEmpty(pTVar4,inWriter,&(this->mType1Input).mPrivateDictionary.StemSnapV,0xc0d);
  inValue_00 = (ulong)(this->mType1Input).mPrivateDictionary.ForceBold;
  if (inValue_00 != 0) {
    CFFPrimitiveWriter::WriteIntegerOperand(inWriter,inValue_00);
    CFFPrimitiveWriter::WriteDictOperator(inWriter,0xc0e);
  }
  lVar3 = (long)(this->mType1Input).mPrivateDictionary.LanguageGroup;
  if (lVar3 != 0) {
    CFFPrimitiveWriter::WriteIntegerOperand(inWriter,lVar3);
    CFFPrimitiveWriter::WriteDictOperator(inWriter,0xc11);
  }
  LVar2 = OutputStringBufferStream::GetCurrentPosition(this_00);
  this->mPrivateSize = LVar2 - this->mPrivatePosition;
  EVar1 = CFFPrimitiveWriter::GetInternalState(inWriter);
  return EVar1;
}

Assistant:

EStatusCode Type1ToCFFEmbeddedFontWriter::WritePrivateDictionary()
{
	mPrivatePosition = mFontFileStream.GetCurrentPosition();

	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueValues,6);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.OtherBlues,7);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.FamilyBlues,8);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.FamilyOtherBlues,9);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueScale,0xC09,0.039625);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueShift,0xC0A,7);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.BlueFuzz,0xC0B,1);
	
	// StdHW
	mPrimitivesWriter.WriteRealOperand(mType1Input.mPrivateDictionary.StdHW);
	mPrimitivesWriter.WriteDictOperator(0xA);

	// StdVW
	mPrimitivesWriter.WriteRealOperand(mType1Input.mPrivateDictionary.StdVW);
	mPrimitivesWriter.WriteDictOperator(0xB);

	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.StemSnapH,0xC0C);
	AddDeltaVectorIfNotEmpty(mPrimitivesWriter,mType1Input.mPrivateDictionary.StemSnapV,0xC0D);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,(int)(mType1Input.mPrivateDictionary.ForceBold ? 1:0),0xC0E,0);
	AddNumberOperandIfNotDefault(mPrimitivesWriter,mType1Input.mPrivateDictionary.LanguageGroup,0xC11,0);

	mPrivateSize = mFontFileStream.GetCurrentPosition() - mPrivatePosition;
	return mPrimitivesWriter.GetInternalState();
}